

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O0

vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> * __thiscall
helics::BaseTimeCoordinator::getDependents(BaseTimeCoordinator *this)

{
  bool bVar1;
  const_iterator __lhs;
  reference pDVar2;
  long in_RSI;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *in_RDI;
  DependencyInfo *dep;
  const_iterator __end1;
  const_iterator __begin1;
  TimeDependencies *__range1;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *deps;
  TimeDependencies *in_stack_ffffffffffffff88;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *this_00;
  __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
  local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI;
  std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::vector
            ((vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> *)0x63e1df
            );
  local_20 = in_RSI + 8;
  local_28._M_current = (DependencyInfo *)TimeDependencies::begin(in_stack_ffffffffffffff88);
  __lhs = TimeDependencies::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::
                 operator==<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                           ((__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)__lhs._M_current,
                            (__normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
                             *)in_stack_ffffffffffffff88), ((bVar1 ^ 0xffU) & 1) != 0) {
    pDVar2 = __gnu_cxx::
             __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
             ::operator*(&local_28);
    if ((pDVar2->dependent & 1U) != 0) {
      std::vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>::push_back
                (this_00,(value_type *)in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_helics::DependencyInfo_*,_std::vector<helics::DependencyInfo,_std::allocator<helics::DependencyInfo>_>_>
    ::operator++(&local_28);
  }
  return this_00;
}

Assistant:

std::vector<GlobalFederateId> BaseTimeCoordinator::getDependents() const
{
    std::vector<GlobalFederateId> deps;
    for (const auto& dep : dependencies) {
        if (dep.dependent) {
            deps.push_back(dep.fedID);
        }
    }
    return deps;
}